

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::hufUnpackEncTable(char **pcode,int ni,int im,int iM,longlong *hcode)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  
  uVar8 = 0;
  memset(hcode,0,0x80008);
  pbVar2 = (byte *)*pcode;
  pbVar9 = pbVar2;
  if (im <= iM) {
    uVar6 = 0;
    do {
      if ((long)ni < (long)pbVar9 - (long)pbVar2) {
        return false;
      }
      uVar4 = uVar8;
      if ((int)uVar8 < 6) {
        do {
          bVar1 = *pbVar9;
          pbVar9 = pbVar9 + 1;
          uVar6 = uVar6 << 8 | (ulong)bVar1;
          uVar4 = uVar8 + 8;
          bVar3 = (int)uVar8 < -2;
          uVar8 = uVar4;
        } while (bVar3);
      }
      uVar8 = uVar4 - 6;
      uVar10 = (uint)((long)uVar6 >> ((byte)uVar8 & 0x3f)) & 0x3f;
      hcode[im] = (ulong)uVar10;
      if ((ulong)uVar10 == 0x3f) {
        if ((long)ni < (long)pbVar9 - (long)pbVar2) {
          return false;
        }
        if (uVar8 < 8) {
          uVar8 = uVar4 + 2;
          bVar1 = *pbVar9;
          pbVar9 = pbVar9 + 1;
          uVar6 = uVar6 << 8 | (ulong)bVar1;
        }
        uVar8 = uVar8 - 8;
        uVar5 = (long)uVar6 >> ((byte)uVar8 & 0x3f);
        if (iM + 1 < (int)(((uint)uVar5 & 0xff) + im + 6)) {
          return false;
        }
        uVar5 = uVar5 & 0xff;
        memset(hcode + im,0,uVar5 * 8 + 0x30);
        iVar7 = im + (int)uVar5 + 5;
      }
      else {
        iVar7 = im;
        if (0x3a < uVar10) {
          if (iM + 1 < (int)(uVar10 + im + -0x39)) {
            return false;
          }
          memset(hcode + im,0,(ulong)(uVar10 - 0x39) << 3);
          iVar7 = im + uVar10 + -0x3a;
        }
      }
      im = iVar7 + 1;
    } while (iVar7 < iM);
  }
  *pcode = (char *)pbVar9;
  hufCanonicalCodeTable(hcode);
  return true;
}

Assistant:

bool hufUnpackEncTable(const char **pcode,  // io: ptr to packed table (updated)
                       int ni,              // i : input size (in bytes)
                       int im,              // i : min hcode index
                       int iM,              // i : max hcode index
                       long long *hcode)    //  o: encoding table [HUF_ENCSIZE]
{
  memset(hcode, 0, sizeof(long long) * HUF_ENCSIZE);

  const char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    if (p - *pcode > ni) {
      return false;
    }

    long long l = hcode[im] = getBits(6, c, lc, p);  // code length

    if (l == (long long)LONG_ZEROCODE_RUN) {
      if (p - *pcode > ni) {
        return false;
      }

      int zerun = getBits(8, c, lc, p) + SHORTEST_LONG_RUN;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    } else if (l >= (long long)SHORT_ZEROCODE_RUN) {
      int zerun = l - SHORT_ZEROCODE_RUN + 2;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    }
  }

  *pcode = const_cast<char *>(p);

  hufCanonicalCodeTable(hcode);

  return true;
}